

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

bool __thiscall OpenGliderConnection::APRSDoLogin(OpenGliderConnection *this)

{
  ssize_t sVar1;
  size_t __n;
  void *__buf;
  int __flags;
  float fVar2;
  char sLogin [120];
  char acStack_98 [128];
  
  __flags = (dataRefs.fdStdDistance * 0x73c) / 1000;
  snprintf(acStack_98,0x78,
           "user LiveTrffc pass -1 vers LiveTraffic %s filter r/%.3f/%.3f/%u -p/oimqstunw\r\n",
           (this->aprsPos)._lat,(this->aprsPos)._lon,LT_VERSION);
  fVar2 = DataRefs::GetMiscNetwTime(&dataRefs);
  this->aprsLastKeepAlive = fVar2;
  __n = 1;
  LTOnlineChannel::DebugLogRaw((LTOnlineChannel *)this,acStack_98,-1,true);
  sVar1 = XPMP2::TCPConnection::send(&this->tcpAprs,(int)acStack_98,__buf,__n,__flags);
  return SUB81(sVar1,0);
}

Assistant:

bool OpenGliderConnection::APRSDoLogin ()
{
    // Prepare login string like "user LiveTrffc pass -1 vers LiveTraffic 2.20 filter r/43.3/-80.2/50 -p/oimqstunw"
    char sLogin[120];
    snprintf(sLogin, sizeof(sLogin), OGN_APRS_LOGIN, LT_VERSION,
             aprsPos.lat(), aprsPos.lon(),
             (unsigned)dataRefs.GetFdStdDistance_km());
    aprsLastKeepAlive = dataRefs.GetMiscNetwTime();     // also counts as a message sent _to_ APRS
    DebugLogRaw(sLogin, HTTP_FLAG_SENDING);
    return tcpAprs.send(sLogin);
}